

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<4>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  ostringstream *this;
  int iVar1;
  bool bVar2;
  int iVar3;
  MessageBuilder *pMVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  GLfloat *value;
  StateQueryMemoryWriteGuard<float[16]> state;
  MessageBuilder local_1b0;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::StateQueryMemoryWriteGuard
            (&state);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,state.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
                    (&state,testCtx);
  if (bVar2) {
    this = &local_1b0.m_str;
    iVar1 = 0;
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar6 = uVar5 & 0xffffffff;
      value = values;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        iVar3 = iVar1 + (int)lVar7;
        if (transpose) {
          iVar3 = (int)uVar6;
        }
        if ((*value != state.m_value[iVar3]) || (NAN(*value) || NAN(state.m_value[iVar3]))) {
          local_1b0.m_log = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
          std::operator<<((ostream *)this,"// ERROR: at index [");
          std::ostream::operator<<(this,(int)uVar5);
          std::operator<<((ostream *)this,"][");
          std::ostream::operator<<(this,(int)lVar7);
          std::operator<<((ostream *)this,"] expected ");
          pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,value);
          std::operator<<((ostream *)&pMVar4->m_str,"; got ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_value + iVar3);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
          if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
        uVar6 = (ulong)((int)uVar6 + 4);
        value = value + 1;
      }
      values = values + 4;
      iVar1 = iVar1 + 4;
    }
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}